

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

bool __thiscall QRegion::intersects(QRegion *this,QRegion *region)

{
  QRegionData *pQVar1;
  QRegionData *pQVar2;
  QRegionPrivate *pQVar3;
  QRect *myRect;
  QRect *pQVar4;
  int iVar5;
  QRect *pQVar6;
  undefined8 uVar7;
  QRect *otherRect;
  undefined8 uVar8;
  QRect *pQVar9;
  undefined8 uVar10;
  QRect *pQVar11;
  int iVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  
  pQVar1 = this->d;
  if ((((pQVar1 == &shared_empty) || (pQVar1->qt_rgn->numRects == 0)) ||
      (pQVar2 = region->d, pQVar2 == &shared_empty)) || (iVar5 = 0, pQVar2->qt_rgn->numRects == 0))
  {
    return false;
  }
  uVar7 = 0xffffffffffffffff;
  if (pQVar1 == &shared_empty) {
    uVar10 = 0;
    uVar8 = 0xffffffffffffffff;
  }
  else {
    pQVar3 = pQVar1->qt_rgn;
    uVar10 = 0;
    uVar8 = 0xffffffffffffffff;
    if (pQVar3->numRects != 0) {
      uVar10._0_4_ = (pQVar3->extents).x1;
      uVar10._4_4_ = (pQVar3->extents).y1;
      uVar8._0_4_ = (pQVar3->extents).x2;
      uVar8._4_4_ = (pQVar3->extents).y2;
      iVar5 = uVar10._4_4_;
    }
  }
  iVar12 = 0;
  if (pQVar2 == &shared_empty) {
    uVar13 = 0;
  }
  else {
    pQVar3 = pQVar2->qt_rgn;
    uVar13 = 0;
    if (pQVar3->numRects != 0) {
      uVar13._0_4_ = (pQVar3->extents).x1;
      uVar13._4_4_ = (pQVar3->extents).y1;
      uVar7._0_4_ = (pQVar3->extents).x2;
      uVar7._4_4_ = (pQVar3->extents).y2;
      iVar12 = uVar13._4_4_;
    }
  }
  if ((int)uVar8 < (int)uVar13) {
    return false;
  }
  if ((int)uVar7 < (int)uVar10) {
    return false;
  }
  if ((int)((ulong)uVar8 >> 0x20) < iVar12) {
    return false;
  }
  if ((int)((ulong)uVar7 >> 0x20) < iVar5) {
    return false;
  }
  pQVar3 = pQVar1->qt_rgn;
  if (pQVar3 != (QRegionPrivate *)0x0) {
    if (((pQVar3->numRects == 1) && (pQVar2->qt_rgn != (QRegionPrivate *)0x0)) &&
       (pQVar2->qt_rgn->numRects == 1)) {
      return true;
    }
    if (pQVar3 != (QRegionPrivate *)0x0) {
      if (pQVar3->numRects == 1) {
        pQVar4 = &pQVar3->extents;
      }
      else {
        pQVar4 = (pQVar3->rects).d.ptr;
      }
      goto LAB_00431c40;
    }
  }
  pQVar4 = (QRect *)0x0;
LAB_00431c40:
  if (pQVar3 == (QRegionPrivate *)0x0) {
    pQVar6 = (QRect *)0x0;
  }
  else {
    if ((long)pQVar3->numRects == 1) {
      pQVar6 = &pQVar3->extents;
    }
    else {
      pQVar6 = (pQVar3->rects).d.ptr;
    }
    pQVar6 = pQVar6 + pQVar3->numRects;
  }
  bVar14 = pQVar4 != pQVar6;
  if (bVar14) {
    pQVar3 = pQVar2->qt_rgn;
    do {
      if (pQVar3 == (QRegionPrivate *)0x0) {
        pQVar9 = (QRect *)0x0;
      }
      else {
        pQVar9 = &pQVar3->extents;
        if (pQVar3->numRects != 1) {
          pQVar9 = (pQVar3->rects).d.ptr;
        }
      }
      if (pQVar3 == (QRegionPrivate *)0x0) {
        pQVar11 = (QRect *)0x0;
      }
      else {
        pQVar11 = &pQVar3->extents;
        if ((long)pQVar3->numRects != 1) {
          pQVar11 = (pQVar3->rects).d.ptr;
        }
        pQVar11 = pQVar11 + pQVar3->numRects;
      }
      bVar15 = pQVar9 == pQVar11;
      if (!bVar15) {
        do {
          if ((((pQVar9->x1).m_i <= (pQVar4->x2).m_i) && ((pQVar4->x1).m_i <= (pQVar9->x2).m_i)) &&
             (((pQVar9->y1).m_i <= (pQVar4->y2).m_i && ((pQVar4->y1).m_i <= (pQVar9->y2).m_i)))) {
            if (!bVar15) {
              return bVar14;
            }
            break;
          }
          pQVar9 = pQVar9 + 1;
          bVar15 = pQVar9 == pQVar11;
        } while (!bVar15);
      }
      pQVar4 = pQVar4 + 1;
      bVar14 = pQVar4 != pQVar6;
    } while (bVar14);
  }
  return bVar14;
}

Assistant:

bool QRegion::isEmpty() const
{
    return d == &shared_empty || d->qt_rgn->numRects == 0;
}